

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

Vector3 __thiscall pm::Sampler::sampleHemisphere(Sampler *this,unsigned_long *count,int *jump)

{
  Type TVar1;
  unsigned_long uVar2;
  uint32_t uVar3;
  int *in_RCX;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  float in_XMM1_Da;
  Vector3 VVar8;
  
  uVar4 = *(ulong *)jump;
  uVar6 = uVar4 % (ulong)*(uint *)((long)count + 0xc);
  if (uVar6 == 0) {
    uVar3 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    iVar7 = uVar3 * *(int *)((long)count + 0xc);
    *in_RCX = iVar7;
    uVar4 = *(ulong *)jump;
    uVar6 = uVar4 % (ulong)*(uint *)((long)count + 0xc);
  }
  else {
    iVar7 = *in_RCX;
  }
  *(ulong *)jump = uVar4 + 1;
  uVar2 = count[9];
  lVar5 = (ulong)(uint)(*(int *)(uVar6 * 4 + count[0xc] + (long)iVar7 * 4) + iVar7) * 0xc;
  this->_vptr_Sampler = *(_func_int ***)(uVar2 + lVar5);
  TVar1 = *(Type *)(uVar2 + 8 + lVar5);
  VVar8.y = 0.0;
  VVar8.x = (float)TVar1;
  this->type_ = TVar1;
  VVar8.z = in_XMM1_Da;
  return VVar8;
}

Assistant:

Vector3 Sampler::sampleHemisphere(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples() == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return hemisphereSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}